

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ReshapeParameter::Clear(ReshapeParameter *this)

{
  BlobShape *pBVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    if (this->shape_ == (BlobShape *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x8c3d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: shape_ != NULL: ");
      google::protobuf::internal::LogFinisher::operator=(&local_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
    }
    pBVar1 = this->shape_;
    (pBVar1->dim_).current_size_ = 0;
    (pBVar1->_has_bits_).has_bits_[0] = 0;
    if (((ulong)(pBVar1->_internal_metadata_).
                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                .ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadataWithArena::DoClear(&pBVar1->_internal_metadata_);
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 6) != 0) {
    this->axis_ = 0;
    this->num_axes_ = -1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ReshapeParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ReshapeParameter)
  if (has_shape()) {
    GOOGLE_DCHECK(shape_ != NULL);
    shape_->::caffe::BlobShape::Clear();
  }
  if (_has_bits_[0 / 32] & 6u) {
    axis_ = 0;
    num_axes_ = -1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}